

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O1

void __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Clear
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this)

{
  ChunkHeader *__ptr;
  ChunkHeader *pCVar1;
  SharedData *pSVar2;
  
  pSVar2 = this->shared_;
  while( true ) {
    __ptr = pSVar2->chunkHead;
    pCVar1 = __ptr->next;
    if (pCVar1 == (ChunkHeader *)0x0) break;
    pSVar2->chunkHead = pCVar1;
    free(__ptr);
    pSVar2 = this->shared_;
  }
  this->shared_->chunkHead->size = 0;
  return;
}

Assistant:

void Clear() RAPIDJSON_NOEXCEPT {
        RAPIDJSON_NOEXCEPT_ASSERT(shared_->refcount > 0);
        for (;;) {
            ChunkHeader* c = shared_->chunkHead;
            if (!c->next) {
                break;
            }
            shared_->chunkHead = c->next;
            baseAllocator_->Free(c);
        }
        shared_->chunkHead->size = 0;
    }